

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratingInstance.cpp
# Opt level: O0

void __thiscall GeneratingInstance::Build(GeneratingInstance *this,Instance *instance)

{
  Instance *pIVar1;
  bool bVar2;
  int iVar3;
  iterator __first;
  iterator __last;
  reference this_00;
  int iVar4;
  Task *task;
  iterator __end1;
  iterator __begin1;
  Tasks *__range1;
  int i;
  Task local_38;
  int local_30;
  int local_2c;
  int newTaskLength;
  int coreLengthSoFar;
  int i_1;
  int optimalProcessingTime;
  int numberOfTaksSoFar;
  int numberOfCores;
  Instance *instance_local;
  GeneratingInstance *this_local;
  
  _numberOfTaksSoFar = instance;
  instance_local = (Instance *)this;
  iVar3 = rand();
  iVar4 = iVar3 % 0x61 + 3;
  i_1 = 0;
  optimalProcessingTime = iVar4;
  iVar3 = rand();
  coreLengthSoFar = iVar4 * (iVar3 % 0x28 + 10);
  for (newTaskLength = 0; newTaskLength < optimalProcessingTime; newTaskLength = newTaskLength + 1)
  {
    for (local_2c = 0; local_2c < coreLengthSoFar; local_2c = local_30 + local_2c) {
      iVar3 = rand();
      pIVar1 = _numberOfTaksSoFar;
      local_30 = iVar3 % 1000 + 3;
      if (coreLengthSoFar < local_2c + local_30) {
        local_30 = coreLengthSoFar - local_2c;
      }
      Task::Task(&local_38,local_30,i_1);
      std::vector<Task,_std::allocator<Task>_>::push_back(&pIVar1->tasks,&local_38);
      i_1 = i_1 + 1;
    }
  }
  __first = std::vector<Task,_std::allocator<Task>_>::begin(&_numberOfTaksSoFar->tasks);
  __last = std::vector<Task,_std::allocator<Task>_>::end(&_numberOfTaksSoFar->tasks);
  std::random_shuffle<__gnu_cxx::__normal_iterator<Task*,std::vector<Task,std::allocator<Task>>>>
            ((__normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_>)
             __first._M_current,
             (__normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_>)__last._M_current
            );
  pIVar1 = _numberOfTaksSoFar;
  __range1._4_4_ = 0;
  __end1 = std::vector<Task,_std::allocator<Task>_>::begin(&_numberOfTaksSoFar->tasks);
  task = (Task *)std::vector<Task,_std::allocator<Task>_>::end(&pIVar1->tasks);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_>
                                *)&task);
    if (!bVar2) break;
    this_00 = __gnu_cxx::__normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_>::
              operator*(&__end1);
    Task::setId(this_00,__range1._4_4_);
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::__normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_>::operator++
              (&__end1);
  }
  _numberOfTaksSoFar->numProcessors = optimalProcessingTime;
  return;
}

Assistant:

void GeneratingInstance::Build(Instance& instance){
	int numberOfCores = rand() % 97 + 3;
	int numberOfTaksSoFar = 0;
	int optimalProcessingTime = numberOfCores * (rand() %40 + 10);
	//Randomly generate Instance's optimum

	for(int i = 0; i < numberOfCores; i++){
		//For every core, generate a random number of tasks, which lengths (also random) when added equal optimum
		int coreLengthSoFar = 0;
		while(coreLengthSoFar<optimalProcessingTime){
			int newTaskLength = rand() %1000 + 3;
			if(coreLengthSoFar + newTaskLength > optimalProcessingTime)
			//Check if newTaskLength does not overload core (aka does not increase optimal processing time), if so trim new TaskLength, so it fits
				newTaskLength = optimalProcessingTime - coreLengthSoFar;

			instance.tasks.push_back(Task(newTaskLength, numberOfTaksSoFar));
			numberOfTaksSoFar++;
			coreLengthSoFar += newTaskLength;
		}
	}

	std::random_shuffle(instance.tasks.begin(), instance.tasks.end());
	//reshuffle for even more random result
	
	int i = 0;
	for(auto& task : instance.tasks){
		task.setId(i);
		i++;
	}

	instance.numProcessors = numberOfCores;
}